

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_decoder.cc
# Opt level: O0

bool __thiscall
draco::DirectBitDecoder::StartDecoding(DirectBitDecoder *this,DecoderBuffer *source_buffer)

{
  bool bVar1;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *this_00;
  int64_t iVar2;
  DecoderBuffer *in_RSI;
  DecoderBuffer *in_RDI;
  uint32_t num_32bit_elements;
  uint32_t size_in_bytes;
  uint *in_stack_ffffffffffffffc0;
  DirectBitDecoder *in_stack_ffffffffffffffd0;
  uint8_t *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe4;
  bool local_1;
  
  Clear(in_stack_ffffffffffffffd0);
  bVar1 = DecoderBuffer::Decode<unsigned_int>(in_RDI,in_stack_ffffffffffffffc0);
  if (bVar1) {
    if ((in_stack_ffffffffffffffe4 == 0) || ((in_stack_ffffffffffffffe4 & 3) != 0)) {
      local_1 = false;
    }
    else {
      this_00 = (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 *)(ulong)in_stack_ffffffffffffffe4;
      iVar2 = DecoderBuffer::remaining_size(in_RSI);
      if (iVar2 < (long)this_00) {
        local_1 = false;
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe4 >> 2),
                   (size_type)in_stack_ffffffffffffffd8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1f917f);
        bVar1 = DecoderBuffer::Decode(in_RDI,this_00,(size_t)in_RSI);
        if (bVar1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI);
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    (this_00,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)in_RSI);
          (in_RDI->bit_decoder_).bit_buffer_ = in_stack_ffffffffffffffd8;
          *(undefined4 *)&(in_RDI->bit_decoder_).bit_buffer_end_ = 0;
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DirectBitDecoder::StartDecoding(DecoderBuffer *source_buffer) {
  Clear();
  uint32_t size_in_bytes;
  if (!source_buffer->Decode(&size_in_bytes)) {
    return false;
  }

  // Check that size_in_bytes is > 0 and a multiple of 4 as the encoder always
  // encodes 32 bit elements.
  if (size_in_bytes == 0 || size_in_bytes & 0x3) {
    return false;
  }
  if (size_in_bytes > source_buffer->remaining_size()) {
    return false;
  }
  const uint32_t num_32bit_elements = size_in_bytes / 4;
  bits_.resize(num_32bit_elements);
  if (!source_buffer->Decode(bits_.data(), size_in_bytes)) {
    return false;
  }
  pos_ = bits_.begin();
  num_used_bits_ = 0;
  return true;
}